

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

qint64 __thiscall QFileDevice::readLineData(QFileDevice *this,char *data,qint64 maxlen)

{
  QFileDevicePrivate *this_00;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var1;
  bool bVar2;
  char cVar3;
  qint64 qVar4;
  
  this_00 = (QFileDevicePrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  bVar2 = QFileDevicePrivate::ensureFlushed(this_00);
  if (bVar2) {
    _Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
         (this_00->fileEngine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
    cVar3 = (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                  _M_head_impl + 0x138))
                      (_Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,1);
    if (cVar3 == '\0') {
      qVar4 = QIODevice::readLineData(&this->super_QIODevice,data,maxlen);
    }
    else {
      _Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
           (this_00->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
      qVar4 = (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0x120))
                        (_Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,data
                         ,maxlen);
    }
    if (qVar4 < maxlen) {
      this_00->cachedSize = 0;
    }
  }
  else {
    qVar4 = -1;
  }
  return qVar4;
}

Assistant:

qint64 QFileDevice::readLineData(char *data, qint64 maxlen)
{
    Q_D(QFileDevice);
    if (!d->ensureFlushed())
        return -1;

    qint64 read;
    if (d->fileEngine->supportsExtension(QAbstractFileEngine::FastReadLineExtension)) {
        read = d->fileEngine->readLine(data, maxlen);
    } else {
        // Fall back to QIODevice's readLine implementation if the engine
        // cannot do it faster.
        read = QIODevice::readLineData(data, maxlen);
    }

    if (read < maxlen) {
        // failed to read all requested, may be at the end of file, stop caching size so that it's rechecked
        d->cachedSize = 0;
    }

    return read;
}